

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void cashew::ValueBuilder::appendDefaultToSwitch(Ref switch_)

{
  Value *this;
  bool bVar1;
  Ref *pRVar2;
  Value *pVVar3;
  Ref RVar4;
  Value *this_00;
  void *__ptr;
  Ref local_38;
  Ref switch__local;
  
  local_38.inst = switch_.inst;
  pRVar2 = Ref::operator[](&local_38,0);
  bVar1 = Ref::operator==(pRVar2,(IString *)&SWITCH);
  if (bVar1) {
    pRVar2 = Ref::operator[](&local_38,2);
    this = pRVar2->inst;
    pVVar3 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    pVVar3->type = Null;
    pVVar3 = cashew::Value::setArray(pVVar3,2);
    __ptr = (void *)0x18;
    RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    (RVar4.inst)->type = Null;
    cashew::Value::free(RVar4.inst,__ptr);
    (RVar4.inst)->type = Null;
    pVVar3 = cashew::Value::push_back(pVVar3,RVar4);
    this_00 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
    this_00->type = Null;
    RVar4.inst = cashew::Value::setArray(this_00,0);
    RVar4.inst = cashew::Value::push_back(pVVar3,RVar4);
    cashew::Value::push_back(this,RVar4);
    return;
  }
  __assert_fail("switch_[0] == SWITCH",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x6eb,"static void cashew::ValueBuilder::appendDefaultToSwitch(Ref)");
}

Assistant:

static void appendDefaultToSwitch(Ref switch_) {
    assert(switch_[0] == SWITCH);
    switch_[2]->push_back(
      &makeRawArray(2)->push_back(makeNull()).push_back(makeRawArray()));
  }